

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_ResumeFinally
          (InterpreterStackFrame *this,byte *ip,JumpOffset jumpOffset,RegSlot exceptionRegSlot,
          RegSlot offsetRegSlot)

{
  bool bVar1;
  int byteOffset;
  Var pvVar2;
  JavascriptExceptionObject *exceptionObject;
  JavascriptExceptionObject *exceptionObj;
  int currOffset;
  bool endOfFinallyBlock;
  int newOffset;
  RegSlot offsetRegSlot_local;
  RegSlot exceptionRegSlot_local;
  JumpOffset jumpOffset_local;
  byte *ip_local;
  InterpreterStackFrame *this_local;
  
  OrFlags(this,4);
  bVar1 = IsInDebugMode(this);
  if (bVar1) {
    pvVar2 = DebugProcess(this);
    currOffset = ::Math::PointerCastToIntegral<int>(pvVar2);
  }
  else {
    pvVar2 = Process(this);
    currOffset = ::Math::PointerCastToIntegral<int>(pvVar2);
  }
  ClearFlags(this,4);
  if (currOffset == 0) {
    pvVar2 = GetNonVarReg(this,offsetRegSlot);
    byteOffset = ::Math::PointerCastToIntegral<int>(pvVar2);
    ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,byteOffset);
    exceptionObject = (JavascriptExceptionObject *)GetNonVarReg(this,exceptionRegSlot);
    if (exceptionObject != (JavascriptExceptionObject *)0x0) {
      JavascriptExceptionOperators::DoThrow(exceptionObject,*(ScriptContext **)(this + 0x78));
    }
  }
  else {
    ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,currOffset);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_ResumeFinally(const byte* ip, Js::JumpOffset jumpOffset, RegSlot exceptionRegSlot, RegSlot offsetRegSlot)
    {
        this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        int newOffset = 0;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->DebugProcess());
        }
        else
#endif
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->Process());
        }

        this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        bool endOfFinallyBlock = newOffset == 0;
        if (endOfFinallyBlock)
        {
            // Finally completed without taking over the flow. Resume where we left off before calling it.
            int currOffset = ::Math::PointerCastToIntegral<int>(GetNonVarReg(offsetRegSlot));
            m_reader.SetCurrentOffset(currOffset);
        }
        else
        {
            // Finally seized the flow with a jump out of its scope. Resume at the jump target and
            // force the runtime to return to this frame without executing the catch.
            m_reader.SetCurrentOffset(newOffset);
            return;
        }

        Js::JavascriptExceptionObject* exceptionObj = (Js::JavascriptExceptionObject*)GetNonVarReg(exceptionRegSlot);
        if (exceptionObj)
        {
            JavascriptExceptionOperators::DoThrow(exceptionObj, scriptContext);
        }
    }